

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

HighsStatus applyScalingToLpRow(HighsLp *lp,HighsInt row,double rowScale)

{
  double dVar1;
  double dVar2;
  reference pvVar3;
  int in_ESI;
  double in_RDI;
  double in_XMM0_Qa;
  HighsSparseMatrix *unaff_retaddr;
  double new_upper;
  HighsInt in_stack_fffffffffffffffc;
  HighsStatus HVar4;
  
  if (in_ESI < 0) {
    HVar4 = kError;
  }
  else if (in_ESI < *(int *)((long)in_RDI + 4)) {
    if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
      HighsSparseMatrix::scaleRow(unaff_retaddr,in_stack_fffffffffffffffc,in_RDI);
      if (in_XMM0_Qa <= 0.0) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)((long)in_RDI + 0x50),
                            (long)in_ESI);
        dVar1 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)((long)in_RDI + 0x68),
                            (long)in_ESI);
        dVar2 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)((long)in_RDI + 0x50),
                            (long)in_ESI);
        *pvVar3 = dVar2 * in_XMM0_Qa;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)((long)in_RDI + 0x68),
                            (long)in_ESI);
        *pvVar3 = dVar1 * in_XMM0_Qa;
      }
      else {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)((long)in_RDI + 0x50),
                            (long)in_ESI);
        *pvVar3 = in_XMM0_Qa * *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)((long)in_RDI + 0x68),
                            (long)in_ESI);
        *pvVar3 = in_XMM0_Qa * *pvVar3;
      }
      HVar4 = kOk;
    }
    else {
      HVar4 = kError;
    }
  }
  else {
    HVar4 = kError;
  }
  return HVar4;
}

Assistant:

HighsStatus applyScalingToLpRow(HighsLp& lp, const HighsInt row,
                                const double rowScale) {
  if (row < 0) return HighsStatus::kError;
  if (row >= lp.num_row_) return HighsStatus::kError;
  if (!rowScale) return HighsStatus::kError;

  lp.a_matrix_.scaleRow(row, rowScale);
  if (rowScale > 0) {
    lp.row_lower_[row] *= rowScale;
    lp.row_upper_[row] *= rowScale;
  } else {
    const double new_upper = lp.row_lower_[row] * rowScale;
    lp.row_lower_[row] = lp.row_upper_[row] * rowScale;
    lp.row_upper_[row] = new_upper;
  }
  return HighsStatus::kOk;
}